

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InReadableOrder.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d82b7b::ReadableOrderTraverser::visit
          (ReadableOrderTraverser *this,Block *block,ReachReason why,Block *header)

{
  bool bVar1;
  Id IVar2;
  Op OVar3;
  ReachReason why_00;
  size_type sVar4;
  Instruction *pIVar5;
  Function *pFVar6;
  Module *pMVar7;
  Instruction *this_00;
  reference ppBVar8;
  pair<std::__detail::_Node_iterator<spv::Block_*,_true,_false>,_bool> pVar9;
  ReachReason mergeWhy;
  ReachReason continueWhy;
  __normal_iterator<spv::Block_*const_*,_std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>_>
  local_a0;
  const_iterator it;
  vector<spv::Block_*,_std::allocator<spv::Block_*>_> *successors;
  Id continueId;
  Id mergeId;
  Instruction *mergeInst;
  Block *continueBlock;
  Block *mergeBlock;
  undefined1 local_40;
  _Node_iterator_base<spv::Block_*,_false> local_38;
  undefined1 local_30;
  Block *local_28;
  Block *header_local;
  Block *pBStack_18;
  ReachReason why_local;
  Block *block_local;
  ReadableOrderTraverser *this_local;
  
  local_28 = header;
  header_local._4_4_ = why;
  pBStack_18 = block;
  block_local = (Block *)this;
  if (block == (Block *)0x0) {
    __assert_fail("block",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/InReadableOrder.cpp"
                  ,0x49,
                  "void (anonymous namespace)::ReadableOrderTraverser::visit(Block *, spv::ReachReason, Block *)"
                 );
  }
  if (why == ReachViaControlFlow) {
    pVar9 = std::
            unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
            ::insert(&this->reachableViaControlFlow_,&stack0xffffffffffffffe8);
    local_38._M_cur =
         (__node_type *)pVar9.first.super__Node_iterator_base<spv::Block_*,_false>._M_cur;
    local_30 = pVar9.second;
  }
  sVar4 = std::
          unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
          ::count(&this->visited_,&stack0xffffffffffffffe8);
  if ((sVar4 == 0) &&
     (sVar4 = std::
              unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
              ::count(&this->delayed_,&stack0xffffffffffffffe8), sVar4 == 0)) {
    std::function<void_(spv::Block_*,_spv::ReachReason,_spv::Block_*)>::operator()
              (&this->callback_,pBStack_18,header_local._4_4_,local_28);
    pVar9 = std::
            unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
            ::insert(&this->visited_,&stack0xffffffffffffffe8);
    mergeBlock = (Block *)pVar9.first.super__Node_iterator_base<spv::Block_*,_false>._M_cur;
    local_40 = pVar9.second;
    continueBlock = (Block *)0x0;
    mergeInst = (Instruction *)0x0;
    pIVar5 = spv::Block::getMergeInstruction(pBStack_18);
    if (pIVar5 != (Instruction *)0x0) {
      IVar2 = spv::Instruction::getIdOperand(pIVar5,0);
      pFVar6 = spv::Block::getParent(pBStack_18);
      pMVar7 = spv::Function::getParent(pFVar6);
      this_00 = spv::Module::getInstruction(pMVar7,IVar2);
      continueBlock = spv::Instruction::getBlock(this_00);
      std::
      unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
      ::insert(&this->delayed_,&continueBlock);
      OVar3 = spv::Instruction::getOpCode(pIVar5);
      if (OVar3 == OpLoopMerge) {
        IVar2 = spv::Instruction::getIdOperand(pIVar5,1);
        pFVar6 = spv::Block::getParent(pBStack_18);
        pMVar7 = spv::Function::getParent(pFVar6);
        pIVar5 = spv::Module::getInstruction(pMVar7,IVar2);
        mergeInst = (Instruction *)spv::Instruction::getBlock(pIVar5);
        std::
        unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
        ::insert(&this->delayed_,(value_type *)&mergeInst);
      }
    }
    if (header_local._4_4_ == ReachViaControlFlow) {
      it._M_current = (Block **)spv::Block::getSuccessors(pBStack_18);
      local_a0._M_current =
           (Block **)
           std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::cbegin
                     ((vector<spv::Block_*,_std::allocator<spv::Block_*>_> *)it._M_current);
      while( true ) {
        _mergeWhy = std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::cend(it._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_a0,
                           (__normal_iterator<spv::Block_*const_*,_std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>_>
                            *)&mergeWhy);
        if (!bVar1) break;
        ppBVar8 = __gnu_cxx::
                  __normal_iterator<spv::Block_*const_*,_std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>_>
                  ::operator*(&local_a0);
        visit(this,*ppBVar8,header_local._4_4_,(Block *)0x0);
        __gnu_cxx::
        __normal_iterator<spv::Block_*const_*,_std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>_>
        ::operator++(&local_a0);
      }
    }
    if (mergeInst != (Instruction *)0x0) {
      sVar4 = std::
              unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
              ::count(&this->reachableViaControlFlow_,(key_type *)&mergeInst);
      std::
      unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
      ::erase(&this->delayed_,(key_type *)&mergeInst);
      visit(this,(Block *)mergeInst,(uint)(sVar4 == 0),pBStack_18);
    }
    if (continueBlock != (Block *)0x0) {
      sVar4 = std::
              unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
              ::count(&this->reachableViaControlFlow_,&continueBlock);
      why_00 = ReachDeadMerge;
      if (sVar4 != 0) {
        why_00 = ReachViaControlFlow;
      }
      std::
      unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
      ::erase(&this->delayed_,&continueBlock);
      visit(this,continueBlock,why_00,pBStack_18);
    }
  }
  return;
}

Assistant:

void visit(Block* block, spv::ReachReason why, Block* header)
    {
        assert(block);
        if (why == spv::ReachViaControlFlow) {
            reachableViaControlFlow_.insert(block);
        }
        if (visited_.count(block) || delayed_.count(block))
            return;
        callback_(block, why, header);
        visited_.insert(block);
        Block* mergeBlock = nullptr;
        Block* continueBlock = nullptr;
        auto mergeInst = block->getMergeInstruction();
        if (mergeInst) {
            Id mergeId = mergeInst->getIdOperand(0);
            mergeBlock = block->getParent().getParent().getInstruction(mergeId)->getBlock();
            delayed_.insert(mergeBlock);
            if (mergeInst->getOpCode() == spv::OpLoopMerge) {
                Id continueId = mergeInst->getIdOperand(1);
                continueBlock =
                    block->getParent().getParent().getInstruction(continueId)->getBlock();
                delayed_.insert(continueBlock);
            }
        }
        if (why == spv::ReachViaControlFlow) {
            const auto& successors = block->getSuccessors();
            for (auto it = successors.cbegin(); it != successors.cend(); ++it)
                visit(*it, why, nullptr);
        }
        if (continueBlock) {
            const spv::ReachReason continueWhy =
                (reachableViaControlFlow_.count(continueBlock) > 0)
                    ? spv::ReachViaControlFlow
                    : spv::ReachDeadContinue;
            delayed_.erase(continueBlock);
            visit(continueBlock, continueWhy, block);
        }
        if (mergeBlock) {
            const spv::ReachReason mergeWhy =
                (reachableViaControlFlow_.count(mergeBlock) > 0)
                    ? spv::ReachViaControlFlow
                    : spv::ReachDeadMerge;
            delayed_.erase(mergeBlock);
            visit(mergeBlock, mergeWhy, block);
        }
    }